

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t *puVar1;
  byte *pbVar2;
  ulong uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint64_t uVar60;
  uint64_t uVar61;
  uint64_t uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  undefined8 uVar66;
  int iVar67;
  undefined4 extraout_EAX;
  secp256k1_scalar *psVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  secp256k1_keypair *keypair;
  secp256k1_keypair *psVar74;
  secp256k1_musig_aggnonce *nonce;
  secp256k1_scalar *r_00;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  void *__s;
  secp256k1_scalar *psVar80;
  secp256k1_scalar *unaff_RBP;
  secp256k1_context *psVar81;
  secp256k1_ge *psVar82;
  undefined4 *puVar83;
  secp256k1_keypair *psVar84;
  secp256k1_keyagg_cache_internal *cache_i;
  uint uVar85;
  uint uVar86;
  secp256k1_context *ctx;
  secp256k1_ge *psVar87;
  secp256k1_fe *psVar88;
  char *pcVar89;
  uint uVar90;
  secp256k1_musig_keyagg_cache *in_R8;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  secp256k1_musig_keyagg_cache *cache;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  secp256k1_musig_session *session;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  secp256k1_gej *a_00;
  secp256k1_ge *psVar103;
  secp256k1_ge *unaff_R13;
  size_t sVar104;
  long lVar105;
  bool bVar106;
  byte bVar107;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar122;
  byte bVar123;
  undefined1 auVar108 [16];
  undefined1 auVar124 [16];
  secp256k1_fe u;
  secp256k1_scalar sStack_910;
  secp256k1_scalar sStack_8f0;
  secp256k1_scalar sStack_8d0;
  secp256k1_ge sStack_8a8;
  secp256k1_ge sStack_840;
  secp256k1_musig_session_internal sStack_7d8;
  secp256k1_scalar sStack_750;
  secp256k1_scalar sStack_730;
  secp256k1_keyagg_cache_internal sStack_710;
  ulong uStack_5f8;
  ulong uStack_5f0;
  ulong uStack_5e8;
  ulong uStack_5e0;
  ulong uStack_5d8;
  secp256k1_fe *psStack_5d0;
  ulong uStack_5c0;
  ulong uStack_5b8;
  ulong uStack_5b0;
  ulong uStack_5a8;
  ulong uStack_5a0;
  ulong uStack_598;
  ulong uStack_590;
  ulong uStack_588;
  ulong uStack_580;
  ulong uStack_578;
  ulong uStack_570;
  ulong uStack_568;
  ulong uStack_560;
  ulong uStack_558;
  ulong uStack_550;
  ulong uStack_548;
  ulong uStack_540;
  ulong uStack_538;
  ulong uStack_530;
  ulong uStack_528;
  ulong uStack_520;
  ulong uStack_518;
  ulong uStack_510;
  ulong uStack_508;
  ulong uStack_500;
  ulong uStack_4f8;
  ulong uStack_4f0;
  ulong uStack_4e8;
  ulong uStack_4e0;
  ulong uStack_4d8;
  ulong uStack_4d0;
  undefined1 auStack_4c8 [16];
  secp256k1_context *psStack_4b0;
  secp256k1_ge *psStack_4a8;
  secp256k1_ge *psStack_4a0;
  secp256k1_scalar *psStack_498;
  secp256k1_scalar *psStack_490;
  code *pcStack_488;
  undefined8 uStack_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  uchar auStack_460 [32];
  secp256k1_ge sStack_440;
  secp256k1_gej sStack_3d0;
  uint uStack_338;
  undefined8 uStack_334;
  undefined8 uStack_32c;
  undefined8 uStack_324;
  undefined8 uStack_31c;
  secp256k1_scalar sStack_310;
  undefined1 auStack_2f0 [40];
  uint64_t uStack_2c8;
  uint64_t uStack_2c0;
  uint64_t uStack_2b8;
  uchar auStack_2b0 [40];
  secp256k1_keyagg_cache_internal sStack_288;
  secp256k1_ge asStack_170 [2];
  secp256k1_scalar *psStack_98;
  secp256k1_ge *psStack_90;
  secp256k1_ge *psStack_88;
  secp256k1_ge *psStack_80;
  secp256k1_gej *psStack_78;
  secp256k1_scalar *psStack_70;
  secp256k1_scalar *local_68;
  uint64_t local_60;
  uint64_t uStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  uint64_t uStack_38;
  
  bVar107 = 0;
  a_00 = a;
  sVar104 = len;
  local_68 = (secp256k1_scalar *)len;
  if (len == 0) {
    psVar68 = (secp256k1_scalar *)0xffffffffffffffff;
  }
  else {
    do {
      psStack_70 = (secp256k1_scalar *)0x1267b0;
      secp256k1_gej_verify(a_00);
      sVar104 = sVar104 - 1;
      a_00 = a_00 + 1;
    } while (sVar104 != 0);
    psVar88 = &a->z;
    psVar68 = (secp256k1_scalar *)0xffffffffffffffff;
    unaff_RBP = (secp256k1_scalar *)0x0;
    unaff_R13 = r;
    do {
      if ((int)psVar88[1].n[0] == 0) {
        if (psVar68 == (secp256k1_scalar *)0xffffffffffffffff) {
          uVar4 = psVar88->n[0];
          uVar60 = psVar88->n[1];
          uVar61 = psVar88->n[2];
          uVar62 = psVar88->n[3];
          iVar67 = psVar88->magnitude;
          iVar65 = psVar88->normalized;
          (unaff_R13->x).n[4] = psVar88->n[4];
          (unaff_R13->x).magnitude = iVar67;
          (unaff_R13->x).normalized = iVar65;
          (unaff_R13->x).n[2] = uVar61;
          (unaff_R13->x).n[3] = uVar62;
          (unaff_R13->x).n[0] = uVar4;
          (unaff_R13->x).n[1] = uVar60;
          psVar68 = unaff_RBP;
        }
        else {
          psStack_70 = (secp256k1_scalar *)0x126800;
          secp256k1_fe_mul(&unaff_R13->x,&r[(long)psVar68].x,psVar88);
          psVar68 = unaff_RBP;
        }
      }
      else {
        psStack_70 = (secp256k1_scalar *)0x1267df;
        secp256k1_ge_set_infinity(unaff_R13);
        len = (size_t)local_68;
      }
      unaff_RBP = (secp256k1_scalar *)((long)unaff_RBP->d + 1);
      unaff_R13 = unaff_R13 + 1;
      psVar88 = (secp256k1_fe *)(psVar88[3].n + 1);
    } while ((secp256k1_scalar *)len != unaff_RBP);
  }
  if (psVar68 == (secp256k1_scalar *)0xffffffffffffffff) {
    return;
  }
  psVar103 = (secp256k1_ge *)((long)psVar68 * 0x68);
  psVar81 = (secp256k1_context *)(r + (long)psVar68);
  ctx = (secp256k1_context *)&stack0xffffffffffffffa0;
  psStack_70 = (secp256k1_scalar *)0x126860;
  secp256k1_fe_inv_var((secp256k1_fe *)ctx,(secp256k1_fe *)psVar81);
  psVar80 = local_68;
  if (psVar68 != (secp256k1_scalar *)0x0) {
    unaff_RBP = (secp256k1_scalar *)((long)psVar68[-1].d + 0x1f);
    unaff_R13 = (secp256k1_ge *)&a[(long)((long)psVar68[-1].d + 0x1f)].infinity;
    psVar103 = r + (long)((long)psVar68[-1].d + 0x1f);
    do {
      if ((int)(unaff_R13->x).n[0] == 0) {
        psStack_70 = (secp256k1_scalar *)0x1268a4;
        secp256k1_fe_mul(&r[(long)psVar68].x,&psVar103->x,(secp256k1_fe *)&stack0xffffffffffffffa0);
        psVar80 = local_68;
        psVar81 = (secp256k1_context *)&stack0xffffffffffffffa0;
        psStack_70 = (secp256k1_scalar *)0x1268c4;
        ctx = psVar81;
        secp256k1_fe_mul((secp256k1_fe *)psVar81,(secp256k1_fe *)psVar81,&a[(long)psVar68].z);
        psVar68 = unaff_RBP;
      }
      unaff_R13 = (secp256k1_ge *)(unaff_R13[-2].y.n + 1);
      psVar103 = psVar103 + -1;
      bVar106 = unaff_RBP != (secp256k1_scalar *)0x0;
      unaff_RBP = (secp256k1_scalar *)((long)unaff_RBP[-1].d + 0x1f);
    } while (bVar106);
  }
  if (a[(long)psVar68].infinity == 0) {
    puVar1 = r[(long)psVar68].x.n + 4;
    *puVar1 = local_40;
    puVar1[1] = uStack_38;
    puVar1 = r[(long)psVar68].x.n + 2;
    *puVar1 = local_50;
    puVar1[1] = uStack_48;
    r[(long)psVar68].x.n[0] = local_60;
    r[(long)psVar68].x.n[1] = uStack_58;
    psVar103 = r;
    psVar68 = psVar80;
    if (psVar80 == (secp256k1_scalar *)0x0) {
      return;
    }
    do {
      if (a->infinity == 0) {
        psStack_70 = (secp256k1_scalar *)0x126937;
        secp256k1_ge_set_gej_zinv(psVar103,a,&psVar103->x);
      }
      a = a + 1;
      psVar68 = (secp256k1_scalar *)((long)psVar68[-1].d + 0x1f);
      psVar103 = psVar103 + 1;
    } while (psVar68 != (secp256k1_scalar *)0x0);
    do {
      psStack_70 = (secp256k1_scalar *)0x12694f;
      secp256k1_ge_verify(r);
      r = r + 1;
      psVar80 = (secp256k1_scalar *)((long)psVar80[-1].d + 0x1f);
    } while (psVar80 != (secp256k1_scalar *)0x0);
    return;
  }
  psStack_70 = (secp256k1_scalar *)secp256k1_musig_nonce_process;
  secp256k1_ge_set_all_gej_var_cold_1();
  psStack_98 = psVar80;
  psStack_90 = psVar103;
  psStack_88 = unaff_R13;
  psStack_80 = r;
  psStack_78 = a;
  psStack_70 = unaff_RBP;
  if (ctx == (secp256k1_context *)0x0) {
    pcStack_488 = (code *)0x126c8f;
    secp256k1_musig_nonce_process_cold_7();
  }
  else if (psVar81 != (secp256k1_context *)0x0) {
    if (nonce == (secp256k1_musig_aggnonce *)0x0) {
      pcStack_488 = (code *)0x126ca1;
      secp256k1_musig_nonce_process_cold_5();
      return;
    }
    if (psVar68 == (secp256k1_scalar *)0x0) {
      pcStack_488 = (code *)0x126cab;
      secp256k1_musig_nonce_process_cold_4();
      return;
    }
    if (in_R8 == (secp256k1_musig_keyagg_cache *)0x0) {
      pcStack_488 = (code *)0x126cb5;
      secp256k1_musig_nonce_process_cold_3();
      return;
    }
    pcStack_488 = (code *)0x1269c9;
    iVar67 = secp256k1_keyagg_cache_load(ctx,&sStack_288,in_R8);
    if (iVar67 == 0) {
      return;
    }
    pcStack_488 = (code *)0x1269e5;
    secp256k1_fe_get_b32(auStack_460,(secp256k1_fe *)&sStack_288);
    pcStack_488 = (code *)0x1269f8;
    iVar67 = secp256k1_musig_aggnonce_load(ctx,asStack_170,nonce);
    if (iVar67 == 0) {
      return;
    }
    sStack_3d0.x.n[0] = 0x6bf7e532c7d5a45;
    sStack_3d0.x.n[1] = 0x971254c089be68a6;
    sStack_3d0.x.n[2] = 0x72846dcd60ac12d2;
    sStack_3d0.x.n[3] = 0xde7a25006c81212f;
    sStack_3d0.z.n[0] = 0x40;
    lVar105 = 0;
    do {
      pcStack_488 = (code *)0x126a42;
      secp256k1_musig_ge_serialize_ext
                ((uchar *)&sStack_440,(secp256k1_ge *)((long)asStack_170[0].x.n + lVar105));
      pcStack_488 = (code *)0x126a52;
      secp256k1_sha256_write((secp256k1_sha256 *)&sStack_3d0,(uchar *)&sStack_440,0x21);
      lVar105 = lVar105 + 0x68;
    } while (lVar105 == 0x68);
    pcStack_488 = (code *)0x126a7e;
    secp256k1_sha256_write((secp256k1_sha256 *)&sStack_3d0,auStack_460,0x20);
    pcStack_488 = (code *)0x126a8e;
    secp256k1_sha256_write((secp256k1_sha256 *)&sStack_3d0,(uchar *)psVar68,0x20);
    pcStack_488 = (code *)0x126aa1;
    secp256k1_sha256_finalize((secp256k1_sha256 *)&sStack_3d0,auStack_2b0);
    pcStack_488 = (code *)0x126aae;
    secp256k1_scalar_set_b32(&sStack_310,auStack_2b0,(int *)0x0);
    pcStack_488 = (code *)0x126ac9;
    secp256k1_effective_nonce(&sStack_3d0,asStack_170,&sStack_310);
    psVar103 = &sStack_440;
    pcStack_488 = (code *)0x126ad9;
    secp256k1_ge_set_gej(psVar103,&sStack_3d0);
    pcStack_488 = (code *)0x126ae1;
    secp256k1_ge_verify(psVar103);
    if (sStack_440.infinity != 0) {
      psVar82 = &secp256k1_ge_const_g;
      psVar87 = &sStack_440;
      for (lVar105 = 0xd; lVar105 != 0; lVar105 = lVar105 + -1) {
        (psVar87->x).n[0] = (psVar82->x).n[0];
        psVar82 = (secp256k1_ge *)((long)psVar82 + ((ulong)bVar107 * -2 + 1) * 8);
        psVar87 = (secp256k1_ge *)((long)psVar87 + ((ulong)bVar107 * -2 + 1) * 8);
      }
    }
    psVar82 = &sStack_440;
    pcStack_488 = (code *)0x126b09;
    secp256k1_fe_normalize_var(&psVar82->x);
    pcStack_488 = (code *)0x126b14;
    secp256k1_fe_get_b32((uchar *)&uStack_480,&psVar82->x);
    psVar87 = (secp256k1_ge *)&sStack_440.y;
    pcStack_488 = (code *)0x126b21;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar87);
    pcStack_488 = (code *)0x126b29;
    psVar88 = (secp256k1_fe *)psVar87;
    secp256k1_fe_verify((secp256k1_fe *)psVar87);
    if (sStack_440.y.normalized != 0) {
      uStack_338 = (uint)sStack_440.y.n[0] & 1;
      psVar87 = (secp256k1_ge *)auStack_2f0;
      pcStack_488 = (code *)0x126b61;
      secp256k1_schnorrsig_challenge
                ((secp256k1_scalar *)psVar87,(uchar *)&uStack_480,(uchar *)psVar68,0x20,auStack_460)
      ;
      psVar68 = (secp256k1_scalar *)(auStack_2f0 + 0x20);
      uStack_2c0 = 0;
      uStack_2b8 = 0;
      auStack_2f0._32_8_ = 0;
      uStack_2c8 = 0;
      pcStack_488 = (code *)0x126b7d;
      secp256k1_scalar_verify(psVar68);
      pcStack_488 = (code *)0x126b8d;
      secp256k1_scalar_verify(&sStack_288.tweak);
      auVar124._0_4_ = -(uint)((int)sStack_288.tweak.d[2] == 0 && (int)sStack_288.tweak.d[0] == 0);
      auVar124._4_4_ = -(uint)(sStack_288.tweak.d[2]._4_4_ == 0 && sStack_288.tweak.d[0]._4_4_ == 0)
      ;
      auVar124._8_4_ = -(uint)((int)sStack_288.tweak.d[3] == 0 && (int)sStack_288.tweak.d[1] == 0);
      auVar124._12_4_ =
           -(uint)(sStack_288.tweak.d[3]._4_4_ == 0 && sStack_288.tweak.d[1]._4_4_ == 0);
      iVar67 = movmskps(extraout_EAX,auVar124);
      if (iVar67 != 0xf) {
        pcStack_488 = (code *)0x126bc0;
        psVar82 = psVar87;
        secp256k1_scalar_mul
                  ((secp256k1_scalar *)&sStack_3d0,(secp256k1_scalar *)psVar87,&sStack_288.tweak);
        psVar103 = (secp256k1_ge *)&sStack_288.pk.y;
        pcStack_488 = (code *)0x126bd0;
        psVar88 = (secp256k1_fe *)psVar103;
        secp256k1_fe_verify((secp256k1_fe *)psVar103);
        if (sStack_288.pk.y.normalized == 0) goto LAB_00126cbe;
        if (((byte)sStack_288.pk.y.n[0] & 1) != 0) {
          pcStack_488 = (code *)0x126bf5;
          secp256k1_scalar_negate((secp256k1_scalar *)&sStack_3d0,(secp256k1_scalar *)&sStack_3d0);
        }
        uStack_2c0 = sStack_3d0.x.n[2];
        uStack_2b8 = sStack_3d0.x.n[3];
        auStack_2f0._32_8_ = sStack_3d0.x.n[0];
        uStack_2c8 = sStack_3d0.x.n[1];
      }
      uStack_324 = uStack_470;
      uStack_31c = uStack_468;
      uStack_334 = uStack_480;
      uStack_32c = uStack_478;
      (psVar81->ecmult_gen_ctx).built = 0x17e9ed9d;
      (psVar81->ecmult_gen_ctx).field_0x4 = (undefined1)uStack_338;
      *(undefined8 *)&(psVar81->ecmult_gen_ctx).field_0x5 = uStack_480;
      *(undefined8 *)((long)(psVar81->ecmult_gen_ctx).scalar_offset.d + 5) = uStack_478;
      *(undefined8 *)((long)(psVar81->ecmult_gen_ctx).scalar_offset.d + 0xd) = uStack_470;
      *(undefined8 *)((long)(psVar81->ecmult_gen_ctx).scalar_offset.d + 0x15) = uStack_468;
      pcStack_488 = (code *)0x126c56;
      secp256k1_scalar_get_b32
                ((uchar *)((long)(psVar81->ecmult_gen_ctx).scalar_offset.d + 0x1d),&sStack_310);
      pcStack_488 = (code *)0x126c62;
      secp256k1_scalar_get_b32
                ((uchar *)((long)(psVar81->ecmult_gen_ctx).ge_offset.x.n + 0x1d),
                 (secp256k1_scalar *)psVar87);
      pcStack_488 = (code *)0x126c71;
      secp256k1_scalar_get_b32
                ((uchar *)((long)(psVar81->ecmult_gen_ctx).ge_offset.y.n + 0xd),psVar68);
      return;
    }
    pcStack_488 = (code *)0x126cbe;
    secp256k1_musig_nonce_process_cold_2();
LAB_00126cbe:
    pcStack_488 = secp256k1_scalar_mul;
    secp256k1_musig_nonce_process_cold_1();
    pcStack_488 = (code *)0x0;
    psStack_5d0 = (secp256k1_fe *)0x126ce5;
    psStack_4b0 = psVar81;
    psStack_4a8 = psVar87;
    psStack_4a0 = psVar103;
    psStack_498 = psVar68;
    psStack_490 = &sStack_310;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar82);
    psStack_5d0 = (secp256k1_fe *)0x126ced;
    secp256k1_scalar_verify(r_00);
    uVar70 = (psVar82->x).n[0];
    uVar3 = (psVar82->x).n[1];
    uVar73 = (psVar82->x).n[2];
    uVar71 = r_00->d[0];
    uVar72 = r_00->d[1];
    uVar102 = r_00->d[2];
    uVar97 = r_00->d[3];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar70;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar71;
    uVar75 = SUB168(auVar5 * auVar21,8);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar75;
    uStack_4f8 = SUB168(auVar5 * auVar21,0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar70;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar72;
    auVar6 = auVar6 * auVar22;
    uVar91 = SUB168(auVar6 + auVar59,0);
    uVar95 = SUB168(auVar6 + auVar59,8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar3;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar71;
    uVar76 = SUB168(auVar7 * auVar23,8);
    uVar69 = SUB168(auVar7 * auVar23,0);
    uStack_4f0 = uVar91 + uVar69;
    uVar69 = (ulong)CARRY8(uVar91,uVar69);
    uVar91 = uVar95 + uVar76;
    uVar96 = uVar91 + uVar69;
    uVar98 = (ulong)CARRY8(auVar6._8_8_,(ulong)CARRY8(uVar75,auVar6._0_8_)) +
             (ulong)(CARRY8(uVar95,uVar76) || CARRY8(uVar91,uVar69));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar70;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar102;
    uVar77 = SUB168(auVar8 * auVar24,8);
    uVar69 = SUB168(auVar8 * auVar24,0);
    uVar75 = uVar96 + uVar69;
    uVar69 = (ulong)CARRY8(uVar96,uVar69);
    uVar76 = uVar98 + uVar77;
    uVar99 = uVar76 + uVar69;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar3;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar72;
    uVar78 = SUB168(auVar9 * auVar25,8);
    uVar91 = SUB168(auVar9 * auVar25,0);
    uVar96 = uVar75 + uVar91;
    uVar91 = (ulong)CARRY8(uVar75,uVar91);
    uVar95 = uVar99 + uVar78;
    uVar100 = uVar95 + uVar91;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar73;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar71;
    uVar79 = SUB168(auVar10 * auVar26,8);
    uVar75 = SUB168(auVar10 * auVar26,0);
    uStack_4e8 = uVar96 + uVar75;
    uVar75 = (ulong)CARRY8(uVar96,uVar75);
    uVar96 = uVar100 + uVar79;
    uVar101 = uVar96 + uVar75;
    uVar100 = (ulong)(CARRY8(uVar98,uVar77) || CARRY8(uVar76,uVar69)) +
              (ulong)(CARRY8(uVar99,uVar78) || CARRY8(uVar95,uVar91)) +
              (ulong)(CARRY8(uVar100,uVar79) || CARRY8(uVar96,uVar75));
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar70;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar97;
    uVar78 = SUB168(auVar11 * auVar27,8);
    uVar70 = SUB168(auVar11 * auVar27,0);
    uVar75 = uVar101 + uVar70;
    uVar69 = (ulong)CARRY8(uVar101,uVar70);
    uVar76 = uVar100 + uVar78;
    uVar101 = uVar76 + uVar69;
    uVar70 = (psVar82->x).n[3];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar3;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar102;
    uVar79 = SUB168(auVar12 * auVar28,8);
    uVar91 = SUB168(auVar12 * auVar28,0);
    uVar96 = uVar75 + uVar91;
    uVar91 = (ulong)CARRY8(uVar75,uVar91);
    uVar95 = uVar101 + uVar79;
    uVar92 = uVar95 + uVar91;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar73;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar72;
    uVar98 = SUB168(auVar13 * auVar29,8);
    uVar75 = SUB168(auVar13 * auVar29,0);
    uVar77 = uVar96 + uVar75;
    uVar75 = (ulong)CARRY8(uVar96,uVar75);
    uVar96 = uVar92 + uVar98;
    uVar93 = uVar96 + uVar75;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar70;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar71;
    uVar99 = SUB168(auVar14 * auVar30,8);
    uVar71 = SUB168(auVar14 * auVar30,0);
    uStack_4e0 = uVar77 + uVar71;
    uVar71 = (ulong)CARRY8(uVar77,uVar71);
    uVar77 = uVar93 + uVar99;
    uVar94 = uVar77 + uVar71;
    uVar78 = (ulong)(CARRY8(uVar100,uVar78) || CARRY8(uVar76,uVar69)) +
             (ulong)(CARRY8(uVar101,uVar79) || CARRY8(uVar95,uVar91)) +
             (ulong)(CARRY8(uVar92,uVar98) || CARRY8(uVar96,uVar75)) +
             (ulong)(CARRY8(uVar93,uVar99) || CARRY8(uVar77,uVar71));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar3;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar97;
    uVar95 = SUB168(auVar15 * auVar31,8);
    uVar71 = SUB168(auVar15 * auVar31,0);
    uVar75 = uVar94 + uVar71;
    uVar71 = (ulong)CARRY8(uVar94,uVar71);
    uVar91 = uVar78 + uVar95;
    uVar79 = uVar91 + uVar71;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar73;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar102;
    uVar96 = SUB168(auVar16 * auVar32,8);
    uVar69 = SUB168(auVar16 * auVar32,0);
    uVar76 = uVar75 + uVar69;
    uVar69 = (ulong)CARRY8(uVar75,uVar69);
    uVar75 = uVar79 + uVar96;
    uVar98 = uVar75 + uVar69;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar70;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar72;
    uVar77 = SUB168(auVar17 * auVar33,8);
    uVar72 = SUB168(auVar17 * auVar33,0);
    uStack_4d8 = uVar76 + uVar72;
    uVar72 = (ulong)CARRY8(uVar76,uVar72);
    uVar76 = uVar98 + uVar77;
    uVar99 = uVar76 + uVar72;
    uVar76 = (ulong)(CARRY8(uVar78,uVar95) || CARRY8(uVar91,uVar71)) +
             (ulong)(CARRY8(uVar79,uVar96) || CARRY8(uVar75,uVar69)) +
             (ulong)(CARRY8(uVar98,uVar77) || CARRY8(uVar76,uVar72));
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar73;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar97;
    uVar69 = SUB168(auVar18 * auVar34,8);
    uVar73 = SUB168(auVar18 * auVar34,0);
    uVar75 = uVar99 + uVar73;
    uVar73 = (ulong)CARRY8(uVar99,uVar73);
    uVar72 = uVar76 + uVar69;
    uVar95 = uVar72 + uVar73;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar70;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar102;
    uVar91 = SUB168(auVar19 * auVar35,8);
    uVar71 = SUB168(auVar19 * auVar35,0);
    uStack_4d0 = uVar75 + uVar71;
    uVar71 = (ulong)CARRY8(uVar75,uVar71);
    uVar102 = uVar95 + uVar91;
    auVar53._8_8_ =
         (ulong)(CARRY8(uVar76,uVar69) || CARRY8(uVar72,uVar73)) +
         (ulong)(CARRY8(uVar95,uVar91) || CARRY8(uVar102,uVar71));
    auVar53._0_8_ = uVar102 + uVar71;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar70;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar97;
    auStack_4c8 = auVar20 * auVar36 + auVar53;
    uVar66 = auStack_4c8._8_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uStack_4f8;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uStack_4d8;
    auVar54 = ZEXT816(0x402da1732fc9bebf) * auVar37 + auVar54;
    uStack_568 = auVar54._0_8_;
    uVar73 = auVar54._8_8_;
    uVar72 = uVar73 + uStack_4f0;
    uVar73 = (ulong)CARRY8(uVar73,uStack_4f0);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uStack_4d0;
    uVar69 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,8);
    uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,0);
    uVar97 = uVar72 + uVar71;
    uVar71 = (ulong)CARRY8(uVar72,uVar71);
    uVar102 = uVar73 + uVar69;
    uVar75 = uVar102 + uVar71;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uStack_4d8;
    uVar91 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,8);
    uVar72 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,0);
    uStack_570 = uVar97 + uVar72;
    uVar72 = (ulong)CARRY8(uVar97,uVar72);
    uVar97 = uVar75 + uVar91;
    uVar95 = uVar97 + uVar72;
    uVar76 = (ulong)(CARRY8(uVar73,uVar69) || CARRY8(uVar102,uVar71)) +
             (ulong)(CARRY8(uVar75,uVar91) || CARRY8(uVar97,uVar72));
    uVar72 = uVar95 + uStack_4e8;
    uVar73 = (ulong)CARRY8(uVar95,uStack_4e8);
    uVar95 = uVar76 + uVar73;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = auStack_4c8._0_8_;
    uVar91 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,8);
    uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,0);
    uVar102 = uVar72 + uVar71;
    uVar71 = (ulong)CARRY8(uVar72,uVar71);
    uVar97 = uVar95 + uVar91;
    uVar96 = uVar97 + uVar71;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uStack_4d0;
    uVar75 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,8);
    uVar72 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,0);
    uVar78 = uVar102 + uVar72;
    uVar72 = (ulong)CARRY8(uVar102,uVar72);
    uVar69 = uVar96 + uVar75;
    uVar77 = uVar69 + uVar72;
    uStack_578 = uVar78 + uStack_4d8;
    uVar102 = (ulong)CARRY8(uVar78,uStack_4d8);
    uVar78 = uVar77 + uVar102;
    uVar95 = (ulong)CARRY8(uVar76,uVar73) + (ulong)(CARRY8(uVar95,uVar91) || CARRY8(uVar97,uVar71))
             + (ulong)(CARRY8(uVar96,uVar75) || CARRY8(uVar69,uVar72)) +
             (ulong)CARRY8(uVar77,uVar102);
    uVar72 = uVar78 + uStack_4e0;
    uVar73 = (ulong)CARRY8(uVar78,uStack_4e0);
    uVar96 = uVar95 + uVar73;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auStack_4c8._8_8_;
    uVar91 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,8);
    uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,0);
    uVar102 = uVar72 + uVar71;
    uVar71 = (ulong)CARRY8(uVar72,uVar71);
    uVar97 = uVar96 + uVar91;
    uVar77 = uVar97 + uVar71;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auStack_4c8._0_8_;
    uVar75 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,8);
    uVar72 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,0);
    uVar76 = uVar102 + uVar72;
    uVar72 = (ulong)CARRY8(uVar102,uVar72);
    uVar69 = uVar77 + uVar75;
    uVar78 = uVar69 + uVar72;
    uStack_580 = uVar76 + uStack_4d0;
    uVar102 = (ulong)CARRY8(uVar76,uStack_4d0);
    uVar76 = uVar78 + uVar102;
    uVar97 = (ulong)CARRY8(uVar95,uVar73) + (ulong)(CARRY8(uVar96,uVar91) || CARRY8(uVar97,uVar71))
             + (ulong)(CARRY8(uVar77,uVar75) || CARRY8(uVar69,uVar72)) +
             (ulong)CARRY8(uVar78,uVar102);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auStack_4c8._8_8_;
    uVar102 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,8);
    uVar73 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,0);
    uVar71 = uVar76 + uVar73;
    uVar73 = (ulong)CARRY8(uVar76,uVar73);
    uVar72 = uVar97 + uVar102;
    uVar69 = uVar72 + uVar73;
    auVar63._8_8_ = uVar69;
    auVar63._0_8_ = uVar71;
    uStack_588 = SUB168(auStack_4c8 + auVar63,0);
    uVar71 = (ulong)CARRY8(uVar71,auStack_4c8._0_8_);
    uVar98 = SUB168(auStack_4c8 + auVar63,8);
    uVar76 = (ulong)(CARRY8(uVar97,uVar102) || CARRY8(uVar72,uVar73)) + (ulong)CARRY8(uVar69,uVar71)
             + (ulong)CARRY8(uVar69 + uVar71,auStack_4c8._8_8_);
    auVar58._8_8_ = uVar76;
    auVar58._0_8_ = uVar98;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uStack_568;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uStack_588;
    auVar55 = ZEXT816(0x402da1732fc9bebf) * auVar45 + auVar55;
    uStack_5a0 = auVar55._0_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uStack_5a0;
    uVar73 = auVar55._8_8_;
    uVar72 = uVar73 + uStack_570;
    uVar73 = (ulong)CARRY8(uVar73,uStack_570);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar98;
    uVar69 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,8);
    uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,0);
    uVar97 = uVar72 + uVar71;
    uVar71 = (ulong)CARRY8(uVar72,uVar71);
    uVar102 = uVar73 + uVar69;
    uVar75 = uVar102 + uVar71;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uStack_588;
    uVar91 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,8);
    uVar72 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,0);
    uStack_5a8 = uVar97 + uVar72;
    uVar72 = (ulong)CARRY8(uVar97,uVar72);
    uVar97 = uVar75 + uVar91;
    uVar96 = uVar97 + uVar72;
    uVar95 = (ulong)(CARRY8(uVar73,uVar69) || CARRY8(uVar102,uVar71)) +
             (ulong)(CARRY8(uVar75,uVar91) || CARRY8(uVar97,uVar72));
    uVar72 = uVar96 + uStack_578;
    uVar73 = (ulong)CARRY8(uVar96,uStack_578);
    uVar96 = uVar95 + uVar73;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar76;
    uVar91 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,8);
    uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,0);
    uVar102 = uVar72 + uVar71;
    uVar71 = (ulong)CARRY8(uVar72,uVar71);
    uVar97 = uVar96 + uVar91;
    uVar77 = uVar97 + uVar71;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar98;
    uVar75 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,8);
    uVar72 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,0);
    uVar79 = uVar102 + uVar72;
    uVar72 = (ulong)CARRY8(uVar102,uVar72);
    uVar69 = uVar77 + uVar75;
    uVar78 = uVar69 + uVar72;
    uStack_5b0 = uVar79 + uStack_588;
    uVar102 = (ulong)CARRY8(uVar79,uStack_588);
    uVar79 = uVar78 + uVar102;
    auVar56._8_8_ =
         (ulong)CARRY8(uVar95,uVar73) + (ulong)(CARRY8(uVar96,uVar91) || CARRY8(uVar97,uVar71)) +
         (ulong)(CARRY8(uVar77,uVar75) || CARRY8(uVar69,uVar72)) + (ulong)CARRY8(uVar78,uVar102) +
         (ulong)CARRY8(uVar79,uStack_580);
    auVar56._0_8_ = uVar79 + uStack_580;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar76;
    auVar58 = ZEXT816(0x4551231950b75fc4) * auVar50 + auVar56 + auVar58;
    uStack_5b8 = auVar58._0_8_;
    uStack_5c0 = auVar58._8_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uStack_5c0;
    auVar64 = ZEXT816(0x402da1732fc9bebf) * auVar51 + auVar64;
    uVar73 = auVar64._8_8_;
    psVar88->n[0] = auVar64._0_8_;
    auVar57[8] = CARRY8(uVar73,uStack_5a8);
    auVar57._0_8_ = uVar73 + uStack_5a8;
    auVar57._9_7_ = 0;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uStack_5c0;
    auVar57 = ZEXT816(0x4551231950b75fc4) * auVar52 + auVar57;
    uVar73 = auVar57._8_8_;
    psVar88->n[1] = auVar57._0_8_;
    uVar71 = uVar73 + uStack_5c0;
    uVar72 = (ulong)CARRY8(uVar73,uStack_5c0) + (ulong)CARRY8(uVar71,uStack_5b0);
    psVar88->n[2] = uVar71 + uStack_5b0;
    uVar71 = (ulong)CARRY8(uVar72,uStack_5b8);
    psVar88->n[3] = uVar72 + uStack_5b8;
    uVar4 = psVar88->n[3];
    keypair = (secp256k1_keypair *)psVar88->n[2];
    uVar73 = psVar88->n[1];
    bVar106 = ((secp256k1_keypair *)0xfffffffffffffffd < keypair && uVar4 == 0xffffffffffffffff) &&
              0xbaaedce6af48a03a < uVar73;
    cache = (secp256k1_musig_keyagg_cache *)(ulong)bVar106;
    uVar90 = (uint)bVar106;
    uVar86 = 0;
    if (0xbaaedce6af48a03b < uVar73) {
      uVar86 = uVar90;
    }
    puVar83 = (undefined4 *)psVar88->n[0];
    session = (secp256k1_musig_session *)0xbfd25e8cd0364140;
    uVar85 = 0;
    if ((undefined4 *)0xbfd25e8cd0364140 < puVar83) {
      uVar85 = uVar90;
    }
    uStack_560._0_4_ = (uint)CARRY8(uVar72,uStack_5b8);
    uVar86 = (uVar85 | uVar86 | (keypair == (secp256k1_keypair *)0xffffffffffffffff &&
                                uVar4 == 0xffffffffffffffff)) + (uint)uStack_560;
    psVar81 = (secp256k1_context *)(ulong)uVar86;
    uStack_598 = uVar76;
    uStack_590 = uVar98;
    uStack_560 = uVar71;
    uStack_558 = uStack_5c0;
    uStack_550 = uStack_5b8;
    uStack_548 = uStack_5b0;
    uStack_540 = uStack_5a8;
    uStack_538 = uStack_5a0;
    uStack_530 = uVar76;
    uStack_528 = uVar98;
    uStack_520 = uStack_588;
    uStack_518 = uStack_580;
    uStack_510 = uStack_578;
    uStack_508 = uStack_570;
    uStack_500 = uStack_568;
    if (uVar86 < 2) {
      uVar71 = (ulong)uVar86;
      uVar70 = (ulong)CARRY8(uVar71 * 0x402da1732fc9bebf,(ulong)puVar83);
      uVar3 = uVar71 * 0x4551231950b75fc4 + uVar73;
      psVar88->n[0] = uVar71 * 0x402da1732fc9bebf + (long)puVar83;
      psVar88->n[1] = uVar3 + uVar70;
      uVar70 = (ulong)(CARRY8(uVar71 * 0x4551231950b75fc4,uVar73) || CARRY8(uVar3,uVar70));
      psVar88->n[2] = (uint64_t)(keypair->data + uVar71 + uVar70);
      psVar88->n[3] =
           uVar4 + (CARRY8((ulong)keypair,uVar71) || CARRY8((ulong)(keypair->data + uVar71),uVar70))
      ;
      psStack_5d0 = (secp256k1_fe *)0x127258;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar88);
      psStack_5d0 = (secp256k1_fe *)0x127260;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar88);
      return;
    }
    psStack_5d0 = (secp256k1_fe *)secp256k1_musig_partial_sign;
    secp256k1_scalar_mul_cold_1();
    uStack_5e0 = uVar66;
    uStack_5f8 = uVar3;
    uStack_5f0 = uVar98;
    uStack_5e8 = uVar76;
    uStack_5d8 = uVar70;
    psStack_5d0 = psVar88;
    if (psVar81 == (secp256k1_context *)0x0) {
      secp256k1_musig_partial_sign_cold_9();
    }
    else if (__s != (void *)0x0) {
      lVar105 = 0;
      psVar74 = keypair;
      do {
        psVar84 = (secp256k1_keypair *)((ulong)psVar74 & 0xffffffff);
        bVar107 = *(byte *)((long)__s + lVar105);
        bVar109 = secp256k1_musig_secnonce_magic[lVar105];
        psVar74 = (secp256k1_keypair *)(ulong)((uint)bVar107 - (uint)bVar109);
        if (bVar107 == bVar109) {
          psVar74 = psVar84;
        }
        iVar67 = (int)psVar74;
        if (bVar107 != bVar109) goto LAB_001272db;
        lVar105 = lVar105 + 1;
      } while (lVar105 != 4);
      iVar67 = 0;
LAB_001272db:
      if (iVar67 == 0) {
        bVar107 = 0;
        bVar109 = 0;
        bVar110 = 0;
        bVar111 = 0;
        bVar112 = 0;
        bVar113 = 0;
        bVar114 = 0;
        bVar115 = 0;
        bVar116 = 0;
        bVar117 = 0;
        bVar118 = 0;
        bVar119 = 0;
        bVar120 = 0;
        bVar121 = 0;
        bVar122 = 0;
        bVar123 = 0;
        lVar105 = 4;
        do {
          pbVar2 = (byte *)((long)__s + lVar105);
          bVar107 = bVar107 | *pbVar2;
          bVar109 = bVar109 | pbVar2[1];
          bVar110 = bVar110 | pbVar2[2];
          bVar111 = bVar111 | pbVar2[3];
          bVar112 = bVar112 | pbVar2[4];
          bVar113 = bVar113 | pbVar2[5];
          bVar114 = bVar114 | pbVar2[6];
          bVar115 = bVar115 | pbVar2[7];
          bVar116 = bVar116 | pbVar2[8];
          bVar117 = bVar117 | pbVar2[9];
          bVar118 = bVar118 | pbVar2[10];
          bVar119 = bVar119 | pbVar2[0xb];
          bVar120 = bVar120 | pbVar2[0xc];
          bVar121 = bVar121 | pbVar2[0xd];
          bVar122 = bVar122 | pbVar2[0xe];
          bVar123 = bVar123 | pbVar2[0xf];
          lVar105 = lVar105 + 0x10;
        } while (lVar105 != 0x44);
        auVar108[0] = -(bVar107 == 0);
        auVar108[1] = -(bVar109 == 0);
        auVar108[2] = -(bVar110 == 0);
        auVar108[3] = -(bVar111 == 0);
        auVar108[4] = -(bVar112 == 0);
        auVar108[5] = -(bVar113 == 0);
        auVar108[6] = -(bVar114 == 0);
        auVar108[7] = -(bVar115 == 0);
        auVar108[8] = -(bVar116 == 0);
        auVar108[9] = -(bVar117 == 0);
        auVar108[10] = -(bVar118 == 0);
        auVar108[0xb] = -(bVar119 == 0);
        auVar108[0xc] = -(bVar120 == 0);
        auVar108[0xd] = -(bVar121 == 0);
        auVar108[0xe] = -(bVar122 == 0);
        auVar108[0xf] = -(bVar123 == 0);
        sStack_710.pk.x.n[1] = (uint64_t)&sStack_840;
        sStack_840.x.n[0]._0_1_ = 0;
        sStack_710.pk.x.n[0] = 0x4d430001;
        sStack_710.pk.x.n[2] = 1;
        sStack_710.pk.x.n[3] = 0;
        sStack_710.pk.x.n[4] = 0;
        sStack_710.pk.x.magnitude = 0;
        sStack_710.pk.x.normalized = 0;
        sStack_7d8.fin_nonce_parity = 0;
        sStack_7d8.fin_nonce[0] = '\0';
        sStack_7d8.fin_nonce[1] = '\0';
        sStack_7d8.fin_nonce[2] = '\0';
        sStack_7d8.fin_nonce[3] = '\0';
        sStack_8a8.x.n[0]._0_4_ =
             (uint)((ushort)((ushort)(SUB161(auVar108 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar108 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar108 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar108 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar108 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar108 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar108 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar108 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar108 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar108 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar108 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar108 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar108 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar108 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar108 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar108[0xf] >> 7) << 0xf) == 0xffff);
        if (psVar81->declassify != 0) {
          secp256k1_musig_partial_sign_cold_1();
        }
        if ((uint)sStack_8a8.x.n[0] == 0) {
          secp256k1_scalar_set_b32(&sStack_8f0,(uchar *)((long)__s + 4),(int *)0x0);
          secp256k1_scalar_set_b32(&sStack_8d0,(uchar *)((long)__s + 0x24),(int *)0x0);
          sStack_710.pk.x.n[0] = *(uint64_t *)((long)__s + 0x44);
          sStack_710.pk.x.n[1] = *(uint64_t *)((long)__s + 0x4c);
          sStack_710.pk.x.n[2] = *(uint64_t *)((long)__s + 0x54);
          sStack_710.pk.x.n[3] = *(uint64_t *)((long)__s + 0x5c);
          sStack_710.pk.x.n[4] = *(uint64_t *)((long)__s + 100);
          sStack_710.pk.x._40_8_ = *(undefined8 *)((long)__s + 0x6c);
          sStack_710.pk.y.n[0] = *(uint64_t *)((long)__s + 0x74);
          sStack_710.pk.y.n[1] = *(uint64_t *)((long)__s + 0x7c);
          secp256k1_ge_from_storage(&sStack_840,(secp256k1_ge_storage *)&sStack_710);
          memset(__s,0,0x84);
          if (puVar83 == (undefined4 *)0x0) {
            secp256k1_musig_partial_sign_cold_7();
            return;
          }
          if (keypair == (secp256k1_keypair *)0x0) {
            secp256k1_musig_partial_sign_cold_6();
            return;
          }
          if (cache == (secp256k1_musig_keyagg_cache *)0x0) {
            secp256k1_musig_partial_sign_cold_5();
            return;
          }
          if (session != (secp256k1_musig_session *)0x0) {
            iVar67 = secp256k1_keypair_load(psVar81,&sStack_910,&sStack_8a8,keypair);
            if (iVar67 != 0) {
              iVar67 = secp256k1_fe_equal(&sStack_840.x,&sStack_8a8.x);
              if ((iVar67 == 0) ||
                 (iVar67 = secp256k1_fe_equal(&sStack_840.y,&sStack_8a8.y), iVar67 == 0)) {
                secp256k1_musig_partial_sign_cold_3();
                return;
              }
              cache_i = &sStack_710;
              iVar67 = secp256k1_keyagg_cache_load(psVar81,cache_i,cache);
              if (iVar67 != 0) {
                psVar88 = &sStack_710.pk.y;
                secp256k1_fe_verify(psVar88);
                if (sStack_710.pk.y.normalized == 0) {
                  secp256k1_musig_partial_sign_cold_2();
                  psVar88->n[2] = 0;
                  psVar88->n[3] = 0;
                  psVar88->n[0] = 0;
                  psVar88->n[1] = 0;
                  (cache_i->pk).x.n[2] = 0;
                  (cache_i->pk).x.n[3] = 0;
                  (cache_i->pk).x.n[0] = 0;
                  (cache_i->pk).x.n[1] = 0;
                  (cache_i->pk).y.n[0] = 0;
                  (cache_i->pk).y.n[1] = 0;
                  (cache_i->pk).x.n[4] = 0;
                  (cache_i->pk).x.magnitude = 0;
                  (cache_i->pk).x.normalized = 0;
                  return;
                }
                if (((uint)sStack_710.pk.y.n[0] & 1) != sStack_710.parity_acc) {
                  secp256k1_scalar_negate(&sStack_910,&sStack_910);
                }
                secp256k1_musig_keyaggcoef_internal
                          (&sStack_730,sStack_710.pks_hash,&sStack_840,&sStack_710.second_pk);
                secp256k1_scalar_mul(&sStack_910,&sStack_910,&sStack_730);
                iVar67 = secp256k1_musig_session_load(psVar81,&sStack_7d8,session);
                if (iVar67 != 0) {
                  if (sStack_7d8.fin_nonce_parity != 0) {
                    secp256k1_scalar_negate(&sStack_8f0,&sStack_8f0);
                    secp256k1_scalar_negate(&sStack_8d0,&sStack_8d0);
                  }
                  secp256k1_scalar_mul(&sStack_750,&sStack_7d8.challenge,&sStack_910);
                  secp256k1_scalar_mul(&sStack_8d0,&sStack_7d8.noncecoef,&sStack_8d0);
                  secp256k1_scalar_add(&sStack_8f0,&sStack_8f0,&sStack_8d0);
                  secp256k1_scalar_add(&sStack_750,&sStack_750,&sStack_8f0);
                  *puVar83 = 0x321afbeb;
                  secp256k1_scalar_get_b32((uchar *)(puVar83 + 1),&sStack_750);
                  secp256k1_musig_partial_sign_clear(&sStack_910,&sStack_8f0);
                  return;
                }
              }
            }
            secp256k1_musig_partial_sign_clear(&sStack_910,&sStack_8f0);
            return;
          }
          secp256k1_musig_partial_sign_cold_4();
          return;
        }
        pcVar89 = "!is_zero";
      }
      else {
        pcVar89 = "secp256k1_memcmp_var(&secnonce->data[0], secp256k1_musig_secnonce_magic, 4) == 0"
        ;
      }
      (*(psVar81->illegal_callback).fn)(pcVar89,(psVar81->illegal_callback).data);
      memset(__s,0,0x84);
      secp256k1_musig_partial_sign_clear(&sStack_910,&sStack_8f0);
      return;
    }
    secp256k1_musig_partial_sign_cold_8();
    return;
  }
  pcStack_488 = (code *)0x126c97;
  secp256k1_musig_nonce_process_cold_6();
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}